

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O1

Trivia __thiscall
slang::parsing::Preprocessor::handleDefaultNetTypeDirective(Preprocessor *this,Token directive)

{
  Token *pTVar1;
  TokenKind TVar2;
  undefined2 uVar3;
  Info *pIVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  int iVar8;
  SourceLocation SVar9;
  DefaultNetTypeDirectiveSyntax *syntax;
  uint uVar10;
  Token TVar11;
  string_view sVar12;
  Token local_68;
  Token local_58;
  Token local_48;
  Trivia local_38;
  
  local_58.info = directive.info;
  local_58._0_8_ = directive._0_8_;
  checkOutsideDesignElement(this,directive);
  Token::Token(&local_68);
  if ((this->currentToken).info == (Info *)0x0) {
    TVar11 = nextProcessed(this);
    this->currentToken = TVar11;
  }
  pTVar1 = &this->currentToken;
  TVar2 = (this->currentToken).kind;
  uVar10 = TVar2 - 0x132;
  if ((uVar10 < 0x21) && ((0x12081003fU >> ((ulong)uVar10 & 0x3f) & 1) != 0)) {
    if ((this->currentToken).info == (Info *)0x0) {
      TVar11 = nextProcessed(this);
      this->currentToken = TVar11;
    }
    uVar3 = (this->currentToken).kind;
    TVar11 = this->currentToken;
    uVar5 = pTVar1->field_0x2;
    NVar6.raw = (pTVar1->numFlags).raw;
    uVar7 = pTVar1->rawLen;
    pIVar4 = (this->currentToken).info;
    (this->lastConsumed).kind = pTVar1->kind;
    (this->lastConsumed).field_0x2 = uVar5;
    (this->lastConsumed).numFlags = (NumericTokenFlags)NVar6.raw;
    (this->lastConsumed).rawLen = uVar7;
    (this->lastConsumed).info = pIVar4;
    Token::Token(&local_48);
    pTVar1->kind = local_48.kind;
    pTVar1->field_0x2 = local_48._2_1_;
    pTVar1->numFlags = (NumericTokenFlags)local_48.numFlags.raw;
    pTVar1->rawLen = local_48.rawLen;
    (this->currentToken).info = local_48.info;
    this->defaultNetType = uVar3;
    local_68 = TVar11;
  }
  else if (TVar2 == Identifier) {
    if ((this->currentToken).info == (Info *)0x0) {
      TVar11 = nextProcessed(this);
      this->currentToken = TVar11;
    }
    local_48.kind = (this->currentToken).kind;
    local_48._2_1_ = (this->currentToken).field_0x2;
    local_48.numFlags.raw = (this->currentToken).numFlags.raw;
    local_48.rawLen = (this->currentToken).rawLen;
    local_48.info = (this->currentToken).info;
    sVar12 = Token::rawText(&local_48);
    if (sVar12._M_len == 4) {
      iVar8 = bcmp(sVar12._M_str,"none",4);
      if (iVar8 == 0) {
        if ((this->currentToken).info == (Info *)0x0) {
          TVar11 = nextProcessed(this);
          this->currentToken = TVar11;
        }
        TVar11 = this->currentToken;
        uVar5 = pTVar1->field_0x2;
        NVar6.raw = (pTVar1->numFlags).raw;
        uVar7 = pTVar1->rawLen;
        pIVar4 = (this->currentToken).info;
        (this->lastConsumed).kind = pTVar1->kind;
        (this->lastConsumed).field_0x2 = uVar5;
        (this->lastConsumed).numFlags = (NumericTokenFlags)NVar6.raw;
        (this->lastConsumed).rawLen = uVar7;
        (this->lastConsumed).info = pIVar4;
        Token::Token(&local_48);
        pTVar1->kind = local_48.kind;
        pTVar1->field_0x2 = local_48._2_1_;
        pTVar1->numFlags = (NumericTokenFlags)local_48.numFlags.raw;
        pTVar1->rawLen = local_48.rawLen;
        (this->currentToken).info = local_48.info;
        this->defaultNetType = Unknown;
        local_68 = TVar11;
      }
    }
  }
  if (local_68.info == (Info *)0x0) {
    SVar9 = Token::location(&local_58);
    sVar12 = Token::rawText(&local_58);
    SVar9 = (SourceLocation)((long)SVar9 + sVar12._M_len * 0x10000000);
    Diagnostics::add(this->diagnostics,(DiagCode)0x70004,SVar9);
    local_68 = Token::createMissing(this->alloc,WireKeyword,SVar9);
  }
  syntax = BumpAllocator::
           emplace<slang::syntax::DefaultNetTypeDirectiveSyntax,slang::parsing::Token&,slang::parsing::Token&>
                     (this->alloc,&local_58,&local_68);
  Trivia::Trivia(&local_38,Directive,(SyntaxNode *)syntax);
  return local_38;
}

Assistant:

Trivia Preprocessor::handleDefaultNetTypeDirective(Token directive) {
    checkOutsideDesignElement(directive);

    Token netType;
    switch (peek().kind) {
        case TokenKind::WireKeyword:
        case TokenKind::UWireKeyword:
        case TokenKind::WAndKeyword:
        case TokenKind::WOrKeyword:
        case TokenKind::TriKeyword:
        case TokenKind::Tri0Keyword:
        case TokenKind::Tri1Keyword:
        case TokenKind::TriAndKeyword:
        case TokenKind::TriOrKeyword:
        case TokenKind::TriRegKeyword:
            netType = consume();
            defaultNetType = netType.kind;
            break;
        case TokenKind::Identifier:
            // none isn't a keyword but it's special here
            if (peek().rawText() == "none") {
                netType = consume();
                defaultNetType = TokenKind::Unknown;
            }
            break;
        default:
            break;
    }

    if (!netType) {
        auto loc = directive.location() + directive.rawText().length();
        addDiag(diag::ExpectedNetType, loc);
        netType = Token::createMissing(alloc, TokenKind::WireKeyword, loc);
    }

    auto result = alloc.emplace<DefaultNetTypeDirectiveSyntax>(directive, netType);
    return Trivia(TriviaKind::Directive, result);
}